

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O2

clientinfo * server::aiman::findaiclient(clientinfo *exclude)

{
  clientinfo *ci;
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  clientinfo *pcVar5;
  
  lVar1 = clients;
  uVar3 = 0;
  uVar4 = (ulong)DAT_00191854;
  if ((int)DAT_00191854 < 1) {
    uVar4 = uVar3;
  }
  pcVar5 = (clientinfo *)0x0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    ci = *(clientinfo **)(lVar1 + uVar3 * 8);
    bVar2 = validaiclient(ci);
    if ((ci != exclude && bVar2) &&
       ((pcVar5 == (clientinfo *)0x0 || ((ci->bots).ulen < (pcVar5->bots).ulen)))) {
      pcVar5 = ci;
    }
  }
  return pcVar5;
}

Assistant:

clientinfo *findaiclient(clientinfo *exclude = NULL)
    {
        clientinfo *least = NULL;
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(!validaiclient(ci) || ci==exclude) continue;
            if(!least || ci->bots.length() < least->bots.length()) least = ci;
        }
        return least;
    }